

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.h
# Opt level: O3

void __thiscall FlatZinc::FlatZincSpace::printDomains(FlatZincSpace *this,ostream *out)

{
  char cVar1;
  pointer pcVar2;
  BoolView *pBVar3;
  uint uVar4;
  mapped_type *pmVar5;
  long lVar6;
  ostream *poVar7;
  Branching BVar8;
  mapped_type *pmVar9;
  long lVar10;
  bool bVar11;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  IntVar *var;
  BoolView otherval;
  string varName;
  key_type local_78;
  key_type local_68;
  char *local_58;
  long local_50;
  char local_48 [16];
  Branching local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
  uVar4 = (this->iv).sz;
  bVar11 = true;
  if (uVar4 != 0) {
    uVar14 = 0;
    do {
      if (((this->iv_introduced).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] >>
           (uVar14 & 0x3f) & 1) == 0) {
        local_78.super_Var.super_Branching._vptr_Branching = (Branching)(this->iv).data[uVar14];
        pmVar5 = std::
                 map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&intVarString_abi_cxx11_,(key_type *)&local_78);
        local_58 = local_48;
        pcVar2 = (pmVar5->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar2,pcVar2 + pmVar5->_M_string_length);
        if ((local_50 != 0) &&
           (lVar6 = std::__cxx11::string::find
                              ((char *)&local_58,(ulong)so.filter_domains._M_dataplus._M_p,0),
           lVar6 != -1)) {
          if (!bVar11) {
            std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
          }
          local_68.super_Var.super_Branching._vptr_Branching._0_1_ = 0x22;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_68,1);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_58,local_50);
          local_68.super_Var.super_Branching._vptr_Branching._0_1_ = 0x22;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_68,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
          std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
          if (*(Tchar **)((long)local_78.super_Var.super_Branching._vptr_Branching + 0x28) ==
              (Tchar *)0x0) {
            local_68.super_Var.super_Branching._vptr_Branching._0_1_ = 0x5b;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_68,1);
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar7,
                                ((Tint *)((long)local_78.super_Var.super_Branching._vptr_Branching +
                                         0xc))->v);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
            poVar7 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar7,
                                ((Tint *)((long)local_78.super_Var.super_Branching._vptr_Branching +
                                         0x10))->v);
            local_68.super_Var.super_Branching._vptr_Branching._0_1_ = 0x5d;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_68,1);
          }
          else {
            iVar13 = ((Tint *)((long)local_78.super_Var.super_Branching._vptr_Branching + 0xc))->v;
            if (iVar13 <= ((Tint *)((long)local_78.super_Var.super_Branching._vptr_Branching + 0x10)
                          )->v) {
              lVar6 = (long)iVar13 + -1;
              bVar11 = true;
              BVar8 = local_78.super_Var.super_Branching._vptr_Branching;
              do {
                if (((Tchar *)BVar8._vptr_Branching[5])[lVar6 + 1].v != '\0') {
                  if (!bVar11) {
                    std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
                  }
                  std::ostream::operator<<((ostream *)out,iVar13);
                  bVar11 = false;
                  BVar8 = local_78.super_Var.super_Branching._vptr_Branching;
                }
                lVar6 = lVar6 + 1;
                iVar13 = iVar13 + 1;
              } while (lVar6 < ((Tint *)(BVar8._vptr_Branching + 2))->v);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>(out,"]",1);
          bVar11 = false;
        }
        if (local_58 != local_48) {
          operator_delete(local_58);
        }
        uVar4 = (this->iv).sz;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < uVar4);
  }
  uVar4 = (this->bv).sz;
  if (uVar4 != 0) {
    lVar6 = 8;
    uVar14 = 0;
    local_38._vptr_Branching = (_func_int **)&PTR_finished_0020bb98;
    do {
      if (((this->bv_introduced).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] >>
           (uVar14 & 0x3f) & 1) == 0) {
        pBVar3 = (this->bv).data;
        local_78.super_Var.super_Branching._vptr_Branching =
             (Branching)(Branching)local_38._vptr_Branching;
        local_78.s = *(bool *)((long)&(pBVar3->super_Var).super_Branching._vptr_Branching +
                              lVar6 + 4);
        local_78.v = *(uint *)((long)&(pBVar3->super_Var).super_Branching._vptr_Branching + lVar6);
        pmVar9 = std::
                 map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&boolVarString_abi_cxx11_,&local_78);
        local_58 = local_48;
        pcVar2 = (pmVar9->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar2,pcVar2 + pmVar9->_M_string_length);
        lVar10 = std::__cxx11::string::find
                           ((char *)&local_58,(ulong)so.filter_domains._M_dataplus._M_p,0);
        if (lVar10 != -1) {
          if (local_50 == 0) {
            local_68.super_Var.super_Branching._vptr_Branching =
                 (Branching)(Branching)local_38._vptr_Branching;
            local_68.v = local_78.v;
            local_68.s = (bool)(local_78.s ^ 1);
            std::
            map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&boolVarString_abi_cxx11_,&local_68);
            std::__cxx11::string::_M_assign((string *)&local_58);
          }
          iVar13 = std::__cxx11::string::compare((char *)&local_58);
          if (iVar13 != 0) {
            if (!bVar11) {
              std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
            }
            pmVar9 = std::
                     map<BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<BoolView>,_std::allocator<std::pair<const_BoolView,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](&boolVarString_abi_cxx11_,&local_78);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (out,(pmVar9->_M_dataplus)._M_p,pmVar9->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
            cVar1 = sat.assigns.data[(uint)local_78.v];
            lVar10 = 7;
            if (cVar1 == '\0') {
              pcVar12 = "\'undef\'";
            }
            else {
              lVar10 = 6;
              pcVar12 = "\'true\'";
              if ((uint)local_78.s * -2 + 1 != (int)cVar1) {
                pcVar12 = "\'false\'";
                lVar10 = 7;
                if ((uint)local_78.s * 2 + -1 != (int)cVar1) {
                  abort();
                }
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>(out,pcVar12,lVar10);
            bVar11 = false;
          }
        }
        if (local_58 != local_48) {
          operator_delete(local_58);
        }
        uVar4 = (this->bv).sz;
      }
      uVar14 = uVar14 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar14 < uVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
  return;
}

Assistant:

void printDomains(std::ostream& out = std::cout) {
		out << "{";
		bool outerFirst = true;

		for (unsigned int i = 0; i < iv.size(); i++) {
			if (iv_introduced[i]) {
				continue;
			}

			IntVar* var = iv[i];
			const std::string varName = intVarString[var];

			if (varName.empty() || varName.find(so.filter_domains) == std::string::npos) {
				continue;
			}

			if (!outerFirst) {
				out << ",";
			}
			outerFirst = false;

			out << '"' << varName << '"' << ":";
			out << "[";
			if (var->vals != nullptr) {
				bool first = true;
				for (int val = var->getMin(); val <= var->getMax(); val++) {
					if (var->vals[val] != 0) {
						if (!first) {
							out << ",";
						}
						first = false;
						out << val;
					}
				}
			} else {
				out << '[' << var->getMin() << "," << var->getMax() << ']';
			}
			out << "]";
		}

		for (unsigned int i = 0; i < bv.size(); i++) {
			if (bv_introduced[i]) {
				continue;
			}

			const BoolView bview = bv[i];
			std::string bvstring = boolVarString[bview];

			if (bvstring.find(so.filter_domains) == std::string::npos) {
				continue;
			}

			// TODO: see if this is actually necessary
			if (bvstring.empty()) {
				// Try the other value
				BoolView otherval = bview;
				otherval.setSign(!otherval.getSign());
				bvstring = boolVarString[otherval];
			}

			if (bvstring == "ASSIGNED_AT_ROOT") {
				continue;
			}

			if (!outerFirst) {
				out << ",";
			}
			outerFirst = false;

			out << boolVarString[bview] << ":";
			/* out << litString[toInt(bview.getLit(true))] << ":"; */
			/* out << litString[toInt(bview.getLit(false))] << ":"; */
			if (!bview.isFixed()) {
				out << "'undef'";
			} else if (bview.isTrue()) {
				out << "'true'";
			} else if (bview.isFalse()) {
				out << "'false'";
			} else {
				abort();
			}
		}
		out << "}";
	}